

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_string_converters.h
# Opt level: O0

string * __thiscall
common::matrix_to_string_abi_cxx11_(string *__return_storage_ptr__,common *this,Matrix<double> *m)

{
  double __val;
  size_t sVar1;
  double *pdVar2;
  double dVar3;
  string local_80 [8];
  string e_string_int;
  string e_string;
  double e;
  uint local_30;
  uint y;
  uint x;
  allocator<char> local_1a;
  undefined1 local_19;
  Matrix<double> *local_18;
  Matrix<double> *m_local;
  string *s;
  
  local_19 = 0;
  local_18 = (Matrix<double> *)this;
  m_local = (Matrix<double> *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  for (local_30 = 0; sVar1 = data_structures::Matrix<double>::get_rows(local_18), local_30 < sVar1;
      local_30 = local_30 + 1) {
    for (e._4_4_ = 0; sVar1 = data_structures::Matrix<double>::get_columns(local_18),
        e._4_4_ < sVar1; e._4_4_ = e._4_4_ + 1) {
      pdVar2 = data_structures::Matrix<double>::read_at(local_18,(ulong)local_30,(ulong)e._4_4_);
      __val = *pdVar2;
      dVar3 = std::numeric_limits<double>::infinity();
      if ((__val != dVar3) || (NAN(__val) || NAN(dVar3))) {
        std::__cxx11::to_string((string *)((long)&e_string_int.field_2 + 8),__val);
        std::__cxx11::string::find(e_string_int.field_2._M_local_buf + 8,0x15b25c);
        std::__cxx11::string::substr((ulong)local_80,(ulong)(e_string_int.field_2._M_local_buf + 8))
        ;
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_80);
        std::__cxx11::string::~string(local_80);
        std::__cxx11::string::~string((string *)(e_string_int.field_2._M_local_buf + 8));
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"@");
      }
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  }
  std::__cxx11::string::pop_back();
  return __return_storage_ptr__;
}

Assistant:

const std::string matrix_to_string(const data_structures::Matrix<double>& m) {
  std::string s("");
  for (unsigned int x = 0; x < m.get_rows(); ++x){
    for (unsigned int y = 0; y < m.get_columns(); ++y){
      double e = m.read_at(x, y);
      if (e == std::numeric_limits<double>::infinity()) {
        s += "@";
      } else {
        std::string e_string = std::to_string(e);
        std::string e_string_int = e_string.substr(0, e_string.find("."));
        s += e_string_int;
      }
    }
    s += "\n";
  }
  s.pop_back();
  return s;
}